

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeModImmTiedInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint Reg;
  DecodeStatus extraout_EAX;
  uint Register;
  
  Reg = FPR128DecoderTable[insn & 0x1f];
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 5 & 0x1f | insn >> 0xb & 0xe0));
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 10 & 0x18));
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeModImmTiedInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned cmode = fieldFromInstruction(insn, 12, 4);
	unsigned imm = fieldFromInstruction(insn, 16, 3) << 5;
	imm |= fieldFromInstruction(insn, 5, 5);

	// Tied operands added twice.
	DecodeVectorRegisterClass(Inst, Rd, Addr, Decoder);
	DecodeVectorRegisterClass(Inst, Rd, Addr, Decoder);

	MCOperand_CreateImm0(Inst, imm);
	MCOperand_CreateImm0(Inst, (cmode & 6) << 2);

	return Success;
}